

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinterface.cpp
# Opt level: O0

int __thiscall UInterface::init(UInterface *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  value_type local_48;
  value_type_conflict1 local_3c;
  string local_38;
  int local_14;
  UInterface *pUStack_10;
  int playerCount_local;
  UInterface *this_local;
  
  local_14 = (int)ctx;
  this->n = local_14;
  pUStack_10 = this;
  GameLogic::startGame(&this->logic,this->n);
  GameLogic::getCommands_abi_cxx11_(&local_38,&this->logic);
  std::__cxx11::string::operator=((string *)&this->jsoncmd,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::operator+=((string *)&this->full_json,(string *)&this->jsoncmd);
  local_3c = -1;
  std::vector<int,_std::allocator<int>_>::assign(&this->ids,(long)this->n,&local_3c);
  local_48 = (value_type)0x0;
  std::vector<DllInterface_*,_std::allocator<DllInterface_*>_>::assign
            (&this->dlls,(long)this->n,&local_48);
  return extraout_EAX;
}

Assistant:

void UInterface::init(int playerCount)
{
    n = playerCount;
    logic.startGame(n);
    jsoncmd = logic.getCommands();
    full_json += jsoncmd;

    ids.assign(n, -1);
    dlls.assign(n, nullptr);
}